

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O0

GLenum switch_rasterizer_with_mode
                 (bov_window_t *window,bov_points_t *points,bov_points_drawing_mode_t mode)

{
  GLenum local_24;
  int local_20;
  GLenum primitive;
  int program_index;
  bov_points_drawing_mode_t mode_local;
  bov_points_t *points_local;
  bov_window_t *window_local;
  
  switch(mode) {
  case POINTS_PROGRAM:
    local_20 = 1;
    local_24 = 0;
    break;
  case LINES_PROGRAM:
    local_20 = 2;
    local_24 = 1;
    break;
  case LINE_LOOP_PROGRAM:
    local_20 = 2;
    local_24 = 2;
    break;
  case LINE_STRIP_PROGRAM:
    local_20 = 2;
    local_24 = 3;
    break;
  case CURVE_PROGRAM:
    local_20 = 3;
    local_24 = 0xb;
    break;
  case TRIANGLES_PROGRAM:
    local_20 = 4;
    local_24 = 4;
    break;
  case TRIANGLE_STRIP_PROGRAM:
    local_20 = 4;
    local_24 = 5;
    break;
  case TRIANGLE_FAN_PROGRAM:
    local_20 = 4;
    local_24 = 6;
    break;
  case FAST_POINTS_PROGRAM:
    local_20 = 5;
    local_24 = 0;
    break;
  case FAST_LINES_PROGRAM:
    local_20 = 5;
    local_24 = 1;
    break;
  case FAST_LINE_LOOP_PROGRAM:
    local_20 = 5;
    local_24 = 2;
    break;
  case FAST_LINE_STRIP_PROGRAM:
    local_20 = 5;
    local_24 = 3;
    break;
  case FAST_TRIANGLES_PROGRAM:
    local_20 = 5;
    local_24 = 4;
    break;
  case FAST_TRIANGLE_STRIP_PROGRAM:
    local_20 = 5;
    local_24 = 5;
    break;
  case FAST_TRIANGLE_FAN_PROGRAM:
    local_20 = 5;
    local_24 = 6;
    break;
  default:
    bov_error_log(0x20001,"this function is private but was given erroneous arguments anyway");
    fprintf(_stderr,"\t(in function %s, line %d)\n","switch_rasterizer_with_mode",0x5c4);
    exit(1);
  }
  if (window->last_program != local_20) {
    (*glad_glUseProgram)(window->program[local_20]);
    window->last_program = local_20;
  }
  (*glad_glBindBuffer)(0x8a11,window->ubo[1]);
  (*glad_glBufferSubData)(0x8a11,0,0x40,&points->param);
  (*glad_glBindVertexArray)(points->vao);
  return local_24;
}

Assistant:

static GLenum switch_rasterizer_with_mode(bov_window_t* window,
                                          const bov_points_t* points,
                                          bov_points_drawing_mode_t mode)
{
	int program_index;
	GLenum primitive = 0;

	switch(mode) {
		case POINTS_PROGRAM:
			program_index = POINTS_PROGRAM_INDEX;
			primitive = GL_POINTS;
			break;
		case LINES_PROGRAM:
			program_index = LINES_PROGRAM_INDEX;
			primitive = GL_LINES;
			break;
		case LINE_LOOP_PROGRAM:
			program_index = LINES_PROGRAM_INDEX;
			primitive = GL_LINE_LOOP;
			break;
		case LINE_STRIP_PROGRAM:
			program_index = LINES_PROGRAM_INDEX;
			primitive = GL_LINE_STRIP;
			break;
		case CURVE_PROGRAM:
			program_index = CURVE_PROGRAM_INDEX;
			primitive = GL_LINE_STRIP_ADJACENCY;
			break;
		case TRIANGLES_PROGRAM:
			program_index = TRIANGLES_PROGRAM_INDEX;
			primitive = GL_TRIANGLES;
			break;
		case TRIANGLE_STRIP_PROGRAM:
			program_index = TRIANGLES_PROGRAM_INDEX;
			primitive = GL_TRIANGLE_STRIP;
			break;
		case TRIANGLE_FAN_PROGRAM:
			program_index = TRIANGLES_PROGRAM_INDEX;
			primitive = GL_TRIANGLE_FAN;
			break;
		// case QUADS_PROGRAM:
		// 	program_index = QUAD_PROGRAM_INDEX;
		// 	primitive = GL_LINES_ADJACENCY;
		// 	break;
		case FAST_POINTS_PROGRAM:
			program_index = DEFAULT_PROGRAM_INDEX;
			primitive = GL_POINTS;
			break;
		case FAST_LINES_PROGRAM:
			program_index = DEFAULT_PROGRAM_INDEX;
			primitive = GL_LINES;
			break;
		case FAST_LINE_LOOP_PROGRAM:
			program_index = DEFAULT_PROGRAM_INDEX;
			primitive = GL_LINE_LOOP;
			break;
		case FAST_LINE_STRIP_PROGRAM:
			program_index = DEFAULT_PROGRAM_INDEX;
			primitive = GL_LINE_STRIP;
			break;
		case FAST_TRIANGLES_PROGRAM:
			program_index = DEFAULT_PROGRAM_INDEX;
			primitive = GL_TRIANGLES;
			break;
		case FAST_TRIANGLE_STRIP_PROGRAM:
			program_index = DEFAULT_PROGRAM_INDEX;
			primitive = GL_TRIANGLE_STRIP;
			break;
		case FAST_TRIANGLE_FAN_PROGRAM:
			program_index = DEFAULT_PROGRAM_INDEX;
			primitive = GL_TRIANGLE_FAN;
			break;
		default:
			BOV_ERROR_LOG(BOV_PARAMETER_ERROR,
			              "this function is private but was "
			              "given erroneous arguments anyway");
			exit(EXIT_FAILURE);
	}

	if(window->last_program!=program_index) {
		glUseProgram(window->program[program_index]);
		window->last_program = program_index;
	}

	// update the object ubo
	glBindBuffer(GL_UNIFORM_BUFFER, window->ubo[1]);
	glBufferSubData(GL_UNIFORM_BUFFER,
	                0,
	                sizeof(bov_points_param_t),
	                &points->param);
	// glBindBuffer(GL_UNIFORM_BUFFER, 0);

	glBindVertexArray(points->vao);

	return primitive;
}